

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

dgBigVector * __thiscall
dgPolyhedra::FaceNormal
          (dgBigVector *__return_storage_ptr__,dgPolyhedra *this,dgEdge *face,HaF64 *pool,
          HaI32 strideInBytes)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  dgEdge *pdVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  lVar9 = (long)(strideInBytes >> 3);
  lVar11 = face->m_incidentVertex * lVar9;
  dVar1 = (double)pool[lVar11];
  if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
    auVar2 = *(undefined1 (*) [16])(pool + lVar11 + 1);
    auVar12._8_8_ = 0x7fffffffffffffff;
    auVar12._0_8_ = 0x7fffffffffffffff;
    auVar12 = vpandq_avx512vl(auVar2,auVar12);
    auVar13._8_8_ = 0x7fefffffffffffff;
    auVar13._0_8_ = 0x7fefffffffffffff;
    uVar6 = vpcmpgtq_avx512vl(auVar12,auVar13);
    if (((((uVar6 & 1) == 0) && (!NAN(auVar2._0_8_))) && ((uVar6 & 3) >> 1 == 0)) &&
       (!NAN((double)pool[lVar11 + 2]))) {
      pdVar10 = face->m_next;
      lVar11 = pdVar10->m_incidentVertex * lVar9;
      if ((ulong)ABS((double)pool[lVar11]) < 0x7ff0000000000000) {
        auVar12 = *(undefined1 (*) [16])(pool + lVar11 + 1);
        auVar3._8_8_ = 0x7fffffffffffffff;
        auVar3._0_8_ = 0x7fffffffffffffff;
        auVar13 = vpandq_avx512vl(auVar12,auVar3);
        auVar4._8_8_ = 0x7fefffffffffffff;
        auVar4._0_8_ = 0x7fefffffffffffff;
        uVar6 = vpcmpgtq_avx512vl(auVar13,auVar4);
        if ((((uVar6 & 1) == 0) && (!NAN(auVar12._0_8_))) &&
           (((uVar6 & 3) >> 1 == 0 && (!NAN((double)pool[lVar11 + 2]))))) {
          dVar16 = (double)pool[lVar11] - dVar1;
          auVar14 = ZEXT864((ulong)dVar16);
          if ((long)ABS(dVar16) < 0x7ff0000000000000) {
            auVar12 = vsubpd_avx(auVar12,auVar2);
            auVar7._8_8_ = 0x7fffffffffffffff;
            auVar7._0_8_ = 0x7fffffffffffffff;
            auVar13 = vandpd_avx512vl(auVar12,auVar7);
            auVar8._8_8_ = 0x7fefffffffffffff;
            auVar8._0_8_ = 0x7fefffffffffffff;
            uVar6 = vpcmpgtq_avx512vl(auVar13,auVar8);
            if (((uVar6 & 1) == 0) && ((uVar6 & 3) >> 1 == 0)) {
              (__return_storage_ptr__->super_dgTemplateVector<double>).m_w = 0.0;
              pdVar10 = pdVar10->m_next;
              if (pdVar10 == face) {
                dVar17 = 0.0;
                dVar18 = 0.0;
                dVar16 = 0.0;
              }
              else {
                auVar19._8_8_ = 0x7fffffffffffffff;
                auVar19._0_8_ = 0x7fffffffffffffff;
                auVar20._8_8_ = 0x7fefffffffffffff;
                auVar20._0_8_ = 0x7fefffffffffffff;
                auVar13 = vshufpd_avx(auVar12,auVar12,1);
                dVar16 = 0.0;
                dVar18 = 0.0;
                dVar17 = 0.0;
                do {
                  lVar11 = pdVar10->m_incidentVertex * lVar9;
                  if (0x7fefffffffffffff < (ulong)ABS((double)pool[lVar11])) {
LAB_0085a399:
                    (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = dVar16;
                    (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = dVar18;
                    (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = dVar17;
                    goto LAB_0085a3a7;
                  }
                  auVar3 = *(undefined1 (*) [16])(pool + lVar11 + 1);
                  auVar4 = vpand_avx(auVar3,auVar19);
                  uVar6 = vpcmpgtq_avx512vl(auVar4,auVar20);
                  if (((((uVar6 & 1) != 0) || (NAN(auVar3._0_8_))) || ((uVar6 & 3) >> 1 != 0)) ||
                     (NAN((double)pool[lVar11 + 2]))) goto LAB_0085a399;
                  dVar5 = (double)pool[lVar11] - dVar1;
                  if (0x7fefffffffffffff < (long)ABS(dVar5)) {
LAB_0085a3c6:
                    (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = dVar16;
                    (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = dVar18;
                    (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = dVar17;
                    goto LAB_0085a3d4;
                  }
                  auVar4 = vsubpd_avx(auVar3,auVar2);
                  auVar3 = vandpd_avx(auVar4,auVar19);
                  uVar6 = vpcmpgtq_avx512vl(auVar3,auVar20);
                  if (((uVar6 & 1) != 0) || ((uVar6 & 3) >> 1 != 0)) goto LAB_0085a3c6;
                  auVar3 = vshufpd_avx(auVar4,auVar4,1);
                  pdVar10 = pdVar10->m_next;
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = auVar4._0_8_ * auVar13._0_8_;
                  auVar7 = vfmsub231sd_fma(auVar22,auVar12,auVar3);
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = dVar5;
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = auVar3._0_8_ * auVar14._0_8_;
                  auVar13 = vfmsub231sd_fma(auVar23,auVar21,auVar13);
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = dVar5 * auVar12._0_8_;
                  auVar12 = vfmsub231sd_fma(auVar15,auVar14._0_16_,auVar4);
                  auVar14 = ZEXT1664(auVar21);
                  dVar16 = auVar7._0_8_ + dVar16;
                  dVar18 = auVar13._0_8_ + dVar18;
                  dVar17 = auVar12._0_8_ + dVar17;
                  auVar12 = auVar4;
                  auVar13 = auVar3;
                } while (pdVar10 != face);
              }
              (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = dVar16;
              (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = dVar18;
              (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = dVar17;
              return __return_storage_ptr__;
            }
          }
LAB_0085a3d4:
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
        }
      }
    }
  }
LAB_0085a3a7:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
}

Assistant:

dgBigVector dgPolyhedra::FaceNormal (dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 strideInBytes) const
{
	hacd::HaI32 stride = strideInBytes / sizeof (hacd::HaF64);
	dgEdge* edge = face;
	dgBigVector p0 (&pool[edge->m_incidentVertex * stride]);
	edge = edge->m_next;
	dgBigVector p1 (&pool[edge->m_incidentVertex * stride]);
	dgBigVector e1 (p1 - p0);

	dgBigVector normal (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
	for (edge = edge->m_next; edge != face; edge = edge->m_next) {
		dgBigVector p2 (&pool[edge->m_incidentVertex * stride]);
		dgBigVector e2 (p2 - p0);
		normal += e1 * e2;
		e1 = e2;
	} 
	return normal;
}